

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfmcs.cc
# Opt level: O1

InputGraph __thiscall
anon_unknown.dwarf_1d6f53::read_vfmcs
          (anon_unknown_dwarf_1d6f53 *this,ifstream *infile,string *filename,bool vertex_labels,
          bool directed)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  GraphFileError *pGVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type __n;
  bool bVar10;
  string_view l;
  string_view label;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = std::istream::get();
  uVar2 = std::istream::get();
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) {
    pGVar7 = (GraphFileError *)__cxa_allocate_exception(0x30);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"error reading size","");
    GraphFileError::GraphFileError(pGVar7,filename,&local_98,true);
    __cxa_throw(pGVar7,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  InputGraph::InputGraph((InputGraph *)this,uVar1 & 0xff | (uVar2 & 0xff) << 8,vertex_labels,false);
  iVar3 = InputGraph::size((InputGraph *)this);
  uVar1 = 0x10;
  if (6 < iVar3) {
    iVar4 = 1;
    uVar2 = 0;
    do {
      iVar4 = iVar4 * 2;
      uVar1 = uVar2 + 1;
      if ((iVar3 * 0x21) / 100 <= iVar4) break;
      bVar10 = uVar2 < 0x10;
      uVar2 = uVar1;
    } while (bVar10);
    uVar1 = 0x11 - uVar1;
  }
  local_78 = filename;
  for (iVar3 = 0; iVar4 = InputGraph::size((InputGraph *)this), iVar3 < iVar4; iVar3 = iVar3 + 1) {
    uVar2 = std::istream::get();
    uVar5 = std::istream::get();
    if (vertex_labels) {
      uVar2 = (uVar2 & 0xff | (uVar5 & 0xff) << 8) >> (uVar1 & 0x1f);
      __n = 1;
      if (((9 < uVar2) && (__n = 2, 99 < uVar2)) && (__n = 3, 999 < uVar2)) {
        __n = 5 - (ulong)(uVar2 < 10000);
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_98,__n,'\0');
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_98._M_dataplus._M_p,(uint)local_98._M_string_length,uVar2);
      l._M_str = local_98._M_dataplus._M_p;
      l._M_len = local_98._M_string_length;
      InputGraph::set_vertex_label((InputGraph *)this,iVar3,l);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) {
    pGVar7 = (GraphFileError *)__cxa_allocate_exception(0x30);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"error reading attributes","");
    GraphFileError::GraphFileError(pGVar7,local_78,&local_98,true);
    __cxa_throw(pGVar7,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  iVar3 = 0;
  while( true ) {
    iVar4 = InputGraph::size((InputGraph *)this);
    if (iVar4 <= iVar3) {
      std::istream::peek();
      if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 2) == 0) {
        pGVar7 = (GraphFileError *)__cxa_allocate_exception(0x30);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"EOF not reached","");
        GraphFileError::GraphFileError(pGVar7,local_78,&local_98,true);
        __cxa_throw(pGVar7,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
      return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
             (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)this;
    }
    uVar1 = std::istream::get();
    uVar2 = std::istream::get();
    if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) break;
    for (uVar1 = (uVar2 & 0xff) << 8 | uVar1 & 0xff; uVar1 != 0; uVar1 = uVar1 - 1) {
      uVar2 = std::istream::get();
      uVar5 = std::istream::get();
      uVar6 = InputGraph::size((InputGraph *)this);
      uVar2 = (uVar5 & 0xff) << 8 | uVar2 & 0xff;
      if (uVar6 <= uVar2) {
        pGVar7 = (GraphFileError *)__cxa_allocate_exception(0x30);
        std::__cxx11::to_string(&local_70,uVar2);
        std::operator+(&local_50,"edge index ",&local_70);
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_50," out of bounds");
        local_98._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
        paVar9 = &pbVar8->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p == paVar9) {
          local_98.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        else {
          local_98.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_98._M_string_length = pbVar8->_M_string_length;
        (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar8->_M_string_length = 0;
        (pbVar8->field_2)._M_local_buf[0] = '\0';
        GraphFileError::GraphFileError(pGVar7,local_78,&local_98,true);
        __cxa_throw(pGVar7,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
      if (directed) {
        label._M_str = "directed";
        label._M_len = 8;
        InputGraph::add_directed_edge((InputGraph *)this,iVar3,uVar2,label);
      }
      else {
        InputGraph::add_edge((InputGraph *)this,iVar3,uVar2);
      }
      std::istream::get();
      std::istream::get();
    }
    iVar3 = iVar3 + 1;
  }
  pGVar7 = (GraphFileError *)__cxa_allocate_exception(0x30);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"error reading edges count","");
  GraphFileError::GraphFileError(pGVar7,local_78,&local_98,true);
  __cxa_throw(pGVar7,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
}

Assistant:

auto read_vfmcs(ifstream && infile, const string & filename, bool vertex_labels, bool directed) -> InputGraph
    {
        int size = read_word(infile);
        if (! infile)
            throw GraphFileError{filename, "error reading size", true};

        InputGraph result{size, vertex_labels, false};

        // to be like the CP 2011 labelling scheme...
        int m = result.size() * 33 / 100;
        int p = 1, k1 = 0, k2 = 0;
        while (p < m && k1 < 16) {
            p *= 2;
            k1 = k2;
            k2++;
        }

        for (int r = 0; r < result.size(); ++r) {
            unsigned l = read_word(infile) >> (16 - k1);
            if (vertex_labels)
                result.set_vertex_label(r, to_string(l));
        }

        if (! infile)
            throw GraphFileError{filename, "error reading attributes", true};

        for (int r = 0; r < result.size(); ++r) {
            int c_end = read_word(infile);
            if (! infile)
                throw GraphFileError{filename, "error reading edges count", true};

            for (int c = 0; c < c_end; ++c) {
                unsigned e = read_word(infile);

                if (e >= unsigned(result.size()))
                    throw GraphFileError{filename, "edge index " + to_string(e) + " out of bounds", true};

                if (directed)
                    result.add_directed_edge(r, e, "directed");
                else
                    result.add_edge(r, e);
                read_word(infile);
            }
        }

        infile.peek();
        if (! infile.eof())
            throw GraphFileError{filename, "EOF not reached", true};

        return result;
    }